

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

string * cs222::toUpper(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  size_type sVar5;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (sVar5 = 0; sVar2 != sVar5; sVar5 = sVar5 + 1) {
    iVar4 = toupper((int)pcVar1[sVar5]);
    pcVar3[sVar5] = (char)iVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUpper(const std::string& str)
    {
        std::string upper(str);
        std::transform(str.begin(), str.end(), upper.begin(), toupper);
        return upper;
    }